

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O1

void Abc_SclComputeLoad(SC_Man *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  void **ppvVar5;
  void *pvVar6;
  SC_Pair *pSVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  SC_WireLoad *pWL;
  int iVar12;
  long lVar13;
  Vec_Flt_t *pVVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  
  pNtk = p->pNtk;
  pVVar15 = pNtk->vObjs;
  iVar12 = pVVar15->nSize;
  lVar13 = (long)iVar12;
  if (0 < lVar13) {
    ppvVar5 = pVVar15->pArray;
    lVar16 = 0;
    do {
      pvVar6 = ppvVar5[lVar16];
      if ((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x14) & 0xf) != 3)) {
        pSVar7 = p->pLoads;
        uVar1 = *(uint *)((long)pvVar6 + 0x10);
        pSVar7[uVar1].rise = 0.0;
        pSVar7[uVar1].fall = 0.0;
      }
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  if (0 < iVar12) {
    ppvVar5 = pVVar15->pArray;
    lVar16 = 0;
    do {
      plVar8 = (long *)ppvVar5[lVar16];
      if ((plVar8 != (long *)0x0) && ((*(uint *)((long)plVar8 + 0x14) & 0xf) == 7)) {
        uVar1 = *(uint *)((long)plVar8 + 0x1c);
        if ((ulong)uVar1 != 0) {
          iVar12 = (int)plVar8[2];
          if ((long)iVar12 < 0) {
LAB_00473108:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar9 = *plVar8;
          if (*(int *)(*(long *)(lVar9 + 0x178) + 4) <= iVar12) goto LAB_00473108;
          uVar2 = *(uint *)(*(long *)(*(long *)(lVar9 + 0x178) + 8) + (long)iVar12 * 4);
          if ((ulong)uVar2 == 0xffffffff) {
            lVar17 = 0;
          }
          else {
            if (((int)uVar2 < 0) || (*(int *)(*(long *)(lVar9 + 0x170) + 100) <= (int)uVar2)) {
LAB_004730ca:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            lVar17 = *(long *)(*(long *)(*(long *)(lVar9 + 0x170) + 0x68) + (ulong)uVar2 * 8);
          }
          if (0 < (int)uVar1) {
            lVar9 = *(long *)(*(long *)(lVar9 + 0x20) + 8);
            lVar10 = plVar8[4];
            pSVar7 = p->pLoads;
            uVar2 = *(uint *)(lVar17 + 0x34);
            if ((int)*(uint *)(lVar17 + 0x34) < 1) {
              uVar2 = 0;
            }
            uVar18 = 0;
            do {
              if (uVar2 == uVar18) goto LAB_004730ca;
              uVar3 = *(uint *)(*(long *)(lVar9 + (long)*(int *)(lVar10 + uVar18 * 4) * 8) + 0x10);
              lVar11 = *(long *)(*(long *)(lVar17 + 0x38) + uVar18 * 8);
              pSVar7[uVar3].rise = *(float *)(lVar11 + 0x10) + pSVar7[uVar3].rise;
              pSVar7[uVar3].fall = *(float *)(lVar11 + 0x14) + pSVar7[uVar3].fall;
              uVar18 = uVar18 + 1;
            } while (uVar1 != uVar18);
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar13);
  }
  lVar13 = (long)pNtk->vCos->nSize;
  if (0 < lVar13) {
    ppvVar5 = pNtk->vCos->pArray;
    pSVar7 = p->pLoads;
    lVar16 = 0;
    do {
      plVar8 = (long *)ppvVar5[lVar16];
      uVar1 = *(uint *)(plVar8 + 2);
      uVar2 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                 (long)*(int *)plVar8[4] * 8) + 0x10);
      pSVar7[uVar2].rise = pSVar7[uVar1].rise + pSVar7[uVar2].rise;
      pSVar7[uVar2].fall = pSVar7[uVar1].fall + pSVar7[uVar2].fall;
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  pWL = p->pWLoadUsed;
  if (pWL != (SC_WireLoad *)0x0) {
    if (p->vWireCaps == (Vec_Flt_t *)0x0) {
      iVar12 = Abc_NtkGetFanoutMax(pNtk);
      pVVar14 = Abc_SclFindWireCaps(pWL,iVar12);
      p->vWireCaps = pVVar14;
    }
    pVVar15 = p->pNtk->vObjs;
    if (0 < pVVar15->nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pVVar15->pArray[lVar13];
        if (((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar6 + 0x1c) != 0)) {
          fVar19 = Abc_SclFindWireLoad(p->vWireCaps,*(int *)((long)pvVar6 + 0x2c));
          pSVar7 = p->pLoads;
          uVar1 = *(uint *)((long)pvVar6 + 0x10);
          pSVar7[uVar1].rise = pSVar7[uVar1].rise + fVar19;
          pSVar7[uVar1].fall = fVar19 + pSVar7[uVar1].fall;
        }
        lVar13 = lVar13 + 1;
        pVVar15 = p->pNtk->vObjs;
      } while (lVar13 < pVVar15->nSize);
    }
    pVVar15 = p->pNtk->vPis;
    if (0 < pVVar15->nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pVVar15->pArray[lVar13];
        fVar19 = Abc_SclFindWireLoad(p->vWireCaps,*(int *)((long)pvVar6 + 0x2c));
        pSVar7 = p->pLoads;
        uVar1 = *(uint *)((long)pvVar6 + 0x10);
        pSVar7[uVar1].rise = pSVar7[uVar1].rise + fVar19;
        pSVar7[uVar1].fall = fVar19 + pSVar7[uVar1].fall;
        lVar13 = lVar13 + 1;
        pVVar15 = p->pNtk->vPis;
      } while (lVar13 < pVVar15->nSize);
    }
  }
  if ((p->vInDrive != (Vec_Flt_t *)0x0) && (pVVar15 = p->pNtk->vPis, 0 < pVVar15->nSize)) {
    uVar18 = 0;
    do {
      iVar12 = *(int *)((long)pVVar15->pArray[uVar18] + 0x38);
      if (((long)iVar12 < 0) || (p->vInDrive->nSize <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar19 = p->vInDrive->pArray[iVar12];
      if ((fVar19 != 0.0) || (NAN(fVar19))) {
        uVar1 = *(uint *)((long)pVVar15->pArray[uVar18] + 0x10);
        if ((fVar19 < p->pLoads[uVar1].rise) || (fVar19 < p->pLoads[uVar1].fall)) {
          printf("Maximum input drive strength is exceeded at primary input %d.\n",
                 uVar18 & 0xffffffff);
        }
      }
      uVar18 = uVar18 + 1;
      pVVar15 = p->pNtk->vPis;
    } while ((long)uVar18 < (long)pVVar15->nSize);
  }
  pVVar15 = p->pNtk->vObjs;
  lVar13 = (long)pVVar15->nSize;
  if (lVar13 < 1) {
    iVar12 = 0;
    fVar19 = 0.0;
  }
  else {
    fVar19 = 0.0;
    lVar16 = 0;
    iVar12 = 0;
    do {
      pvVar6 = pVVar15->pArray[lVar16];
      if (((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 7)) &&
         (*(int *)((long)pvVar6 + 0x1c) != 0)) {
        fVar19 = fVar19 + p->pLoads[*(uint *)((long)pvVar6 + 0x10)].fall * 0.5 +
                          p->pLoads[*(uint *)((long)pvVar6 + 0x10)].rise * 0.5;
        iVar12 = iVar12 + 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  pVVar15 = p->pNtk->vPis;
  iVar4 = pVVar15->nSize;
  if (0 < (long)iVar4) {
    lVar13 = 0;
    do {
      uVar1 = *(uint *)((long)pVVar15->pArray[lVar13] + 0x10);
      fVar19 = fVar19 + p->pLoads[uVar1].fall * 0.5 + p->pLoads[uVar1].rise * 0.5;
      lVar13 = lVar13 + 1;
    } while (iVar4 != lVar13);
    iVar12 = iVar12 + iVar4;
  }
  p->EstLoadAve = fVar19 / (float)iVar12;
  return;
}

Assistant:

void Abc_SclComputeLoad( SC_Man * p )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // clear load storage
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        if ( !Abc_ObjIsPo(pObj) )
            pLoad->rise = pLoad->fall = 0.0;
    }
    // add cell load
    Abc_NtkForEachNode1( p->pNtk, pObj, i )
    {
        SC_Cell * pCell = Abc_SclObjCell( pObj );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
            SC_Pin * pPin = SC_CellPin( pCell, k );
            pLoad->rise += pPin->rise_cap;
            pLoad->fall += pPin->fall_cap;
        }
    }
    // add PO load
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pLoadPo = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoad = Abc_SclObjLoad( p, Abc_ObjFanin0(pObj) );
        pLoad->rise += pLoadPo->rise;
        pLoad->fall += pLoadPo->fall;
    }
    // add wire load
    if ( p->pWLoadUsed != NULL )
    {
        if ( p->vWireCaps == NULL )
            p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(p->pNtk) );
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
        Abc_NtkForEachPi( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
    }
    // check input loads
    if ( p->vInDrive != NULL )
    {
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            if ( Abc_SclObjInDrive(p, pObj) != 0 && (pLoad->rise > Abc_SclObjInDrive(p, pObj) || pLoad->fall > Abc_SclObjInDrive(p, pObj)) )
                printf( "Maximum input drive strength is exceeded at primary input %d.\n", i );
        }
    }
/*
    // transfer load from barbufs
    Abc_NtkForEachBarBuf( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoadF = Abc_SclObjLoad( p, Abc_ObjFanin(pObj, 0) );
        SC_PairAdd( pLoadF, pLoad );
    }
*/
    // calculate average load
//    if ( p->EstLoadMax )
    {
        double TotalLoad = 0;
        int nObjs = 0;
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        p->EstLoadAve = (float)(TotalLoad / nObjs);
//        printf( "Average load = %.2f\n", p->EstLoadAve );
    }
}